

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O3

void __thiscall Downloader::calculateTimeRemaining(Downloader *this,qint64 received,qint64 total)

{
  uint uVar1;
  QLabel *pQVar2;
  double dVar3;
  QArrayData *pQVar4;
  undefined8 uVar5;
  QArrayData *pQVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  QByteArrayView QVar12;
  QString t;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QArrayData *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayData *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  QArrayData *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  QDateTime::currentDateTime();
  iVar9 = QDateTime::toSecsSinceEpoch();
  uVar1 = this->m_startTime;
  QDateTime::~QDateTime((QDateTime *)&local_a8);
  uVar11 = iVar9 - uVar1;
  if (uVar11 == 0) {
    return;
  }
  local_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  local_78 = 0;
  lVar10 = (total - received) / (received / (long)(ulong)uVar11);
  dVar3 = (double)lVar10;
  if (lVar10 < 0x1c21) {
    if (lVar10 < 0x3d) {
      if ((int)(dVar3 + 0.5) < 2) {
        QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x119f02);
        goto LAB_001153cc;
      }
      QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x119ef7);
      QString::arg((longlong)&local_a8,(int)&local_70,(int)(dVar3 + 0.5),(QChar)0x0);
      goto LAB_0011532b;
    }
    iVar9 = (int)(dVar3 / 60.0 + 0.5);
    if (1 < iVar9) {
      QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x119ee3);
      QString::arg((longlong)&local_a8,(int)&local_70,iVar9,(QChar)0x0);
      goto LAB_0011532b;
    }
    QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x119eee);
LAB_001153cc:
    uVar8 = local_78;
    uVar7 = uStack_80;
    local_70 = local_88;
    uVar5 = local_98;
    uStack_80 = uStack_a0;
    pQVar4 = local_a8;
    local_a8 = local_88;
    local_88 = pQVar4;
    uStack_a0 = uVar7;
    local_98 = local_78;
    local_78 = uVar5;
    if (local_70 == (QArrayData *)0x0) goto LAB_00115411;
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar9 = (local_70->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    local_a8 = local_70;
    local_98 = uVar8;
  }
  else {
    iVar9 = (int)(dVar3 / 3600.0 + 0.5);
    if (iVar9 < 2) {
      QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x119ed4);
      goto LAB_001153cc;
    }
    QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x119ec5);
    QString::arg((longlong)&local_a8,(int)&local_70,iVar9,(QChar)0x0);
LAB_0011532b:
    uVar7 = uStack_80;
    pQVar6 = local_88;
    uVar5 = local_98;
    pQVar4 = local_a8;
    local_a8 = local_88;
    local_88 = pQVar4;
    uStack_80 = uStack_a0;
    uStack_a0 = uVar7;
    local_98 = local_78;
    local_78 = uVar5;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,8);
      }
    }
    if (local_70 == (QArrayData *)0x0) goto LAB_00115411;
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar9 = (local_70->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  if (iVar9 == 0) {
    QArrayData::deallocate(local_70,2,8);
  }
LAB_00115411:
  pQVar2 = (this->m_ui->super_Ui_Downloader).timeLabel;
  QMetaObject::tr((char *)&local_40,(char *)&staticMetaObject,0x119b8e);
  local_58 = local_40;
  local_50 = local_38;
  uStack_48 = uStack_30;
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar12.m_data = (storage_type *)0x2;
  QVar12.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar12);
  QString::append((QString *)&local_58);
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,8);
    }
  }
  local_70 = local_58;
  local_68 = local_50;
  uStack_60 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_70);
  QLabel::setText((QString *)pQVar2);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  return;
}

Assistant:

void Downloader::calculateTimeRemaining(qint64 received, qint64 total)
{
   uint difference = QDateTime::currentDateTime().toSecsSinceEpoch() - m_startTime;

   if (difference > 0)
   {
      QString timeString;
      qreal timeRemaining = (total - received) / (received / difference);

      if (timeRemaining > 7200)
      {
         timeRemaining /= 3600;
         int hours = int(timeRemaining + 0.5);

         if (hours > 1)
            timeString = tr("about %1 hours").arg(hours);
         else
            timeString = tr("about one hour");
      }

      else if (timeRemaining > 60)
      {
         timeRemaining /= 60;
         int minutes = int(timeRemaining + 0.5);

         if (minutes > 1)
            timeString = tr("%1 minutes").arg(minutes);
         else
            timeString = tr("1 minute");
      }

      else if (timeRemaining <= 60)
      {
         int seconds = int(timeRemaining + 0.5);

         if (seconds > 1)
            timeString = tr("%1 seconds").arg(seconds);
         else
            timeString = tr("1 second");
      }

      m_ui->timeLabel->setText(tr("Time remaining") + ": " + timeString);
   }
}